

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

string * path_basename(string *__return_storage_ptr__,string *name)

{
  path local_98;
  path local_58;
  string *local_18;
  string *name_local;
  
  local_18 = name;
  name_local = __return_storage_ptr__;
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_98,name);
  std::experimental::filesystem::v1::__cxx11::path::stem(&local_58,&local_98);
  std::experimental::filesystem::v1::__cxx11::path::string(__return_storage_ptr__,&local_58);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_58);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::string path_basename(const std::string& name)
{
    return fs::path(name).stem().string();
}